

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O0

void __thiscall
QDBusPlatformMenu::removeMenuItem(QDBusPlatformMenu *this,QPlatformMenuItem *menuItem)

{
  QPlatformMenu *pQVar1;
  QDBusPlatformMenuItem *in_RSI;
  Object *in_RDI;
  long in_FS_OFFSET;
  QDBusPlatformMenu *menu;
  QDBusPlatformMenuItem *item;
  QDBusPlatformMenuItem **in_stack_ffffffffffffff58;
  Object *sender;
  offset_in_QDBusPlatformMenu_to_subr in_stack_ffffffffffffff90;
  code *slot;
  offset_in_QDBusPlatformMenu_to_subr in_stack_ffffffffffffffa0;
  code *signal;
  undefined8 local_18;
  QDBusPlatformMenuItem *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  QList<QDBusPlatformMenuItem*>::removeAll<QDBusPlatformMenuItem*>
            ((QList<QDBusPlatformMenuItem_*> *)in_RDI,in_stack_ffffffffffffff58);
  sender = (Object *)&in_RDI->m_itemsByTag;
  local_18 = (**(code **)(*(long *)in_RSI + 0x68))();
  QHash<unsigned_long_long,_QDBusPlatformMenuItem_*>::remove
            ((QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)sender,(char *)&local_18);
  pQVar1 = QDBusPlatformMenuItem::menu(local_10);
  if (pQVar1 != (QPlatformMenu *)0x0) {
    QDBusPlatformMenuItem::menu(local_10);
    QObject::
    disconnect<void(QDBusPlatformMenu::*)(QList<QDBusMenuItem>,QList<QDBusMenuItemKeys>),void(QDBusPlatformMenu::*)(QList<QDBusMenuItem>,QList<QDBusMenuItemKeys>)>
              (sender,in_stack_ffffffffffffffa0,in_RDI,in_stack_ffffffffffffff90);
    signal = updated;
    slot = updated;
    QObject::
    disconnect<void(QDBusPlatformMenu::*)(unsigned_int,int),void(QDBusPlatformMenu::*)(unsigned_int,int)>
              (sender,0xb18ce0,in_RDI,0xb18ce0);
    QObject::
    disconnect<void(QDBusPlatformMenu::*)(int,unsigned_int),void(QDBusPlatformMenu::*)(int,unsigned_int)>
              (sender,(offset_in_QDBusPlatformMenu_to_subr)signal,in_RDI,
               (offset_in_QDBusPlatformMenu_to_subr)slot);
  }
  emitUpdated(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusPlatformMenu::removeMenuItem(QPlatformMenuItem *menuItem)
{
    QDBusPlatformMenuItem *item = static_cast<QDBusPlatformMenuItem *>(menuItem);
    m_items.removeAll(item);
    m_itemsByTag.remove(menuItem->tag());
    if (item->menu()) {
        // disconnect from the signals we connected to in syncSubMenu()
        const QDBusPlatformMenu *menu = static_cast<const QDBusPlatformMenu *>(item->menu());
        disconnect(menu, &QDBusPlatformMenu::propertiesUpdated,
                   this, &QDBusPlatformMenu::propertiesUpdated);
        disconnect(menu, &QDBusPlatformMenu::updated,
                   this, &QDBusPlatformMenu::updated);
        disconnect(menu, &QDBusPlatformMenu::popupRequested,
                   this, &QDBusPlatformMenu::popupRequested);
    }
    emitUpdated();
}